

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v8::detail::write_exponent<char,fmt::v8::appender>(int exp,appender it)

{
  char cVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  lVar2 = *(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                   0x10);
  uVar4 = lVar2 + 1;
  if (exp < 0) {
    if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                  0x18) < uVar4) {
      (*(code *)**(undefined8 **)
                  it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
                (it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
      lVar2 = *(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                              container + 0x10);
      uVar4 = lVar2 + 1;
    }
    *(ulong *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container + 0x10)
         = uVar4;
    *(undefined1 *)
     (*(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container + 8) +
     lVar2) = 0x2d;
    exp = -exp;
  }
  else {
    if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                  0x18) < uVar4) {
      (*(code *)**(undefined8 **)
                  it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
                (it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
      lVar2 = *(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                              container + 0x10);
      uVar4 = lVar2 + 1;
    }
    *(ulong *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container + 0x10)
         = uVar4;
    *(undefined1 *)
     (*(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container + 8) +
     lVar2) = 0x2b;
  }
  if (99 < (uint)exp) {
    uVar4 = (ulong)(((uint)exp / 100) * 2);
    if (999 < (uint)exp) {
      cVar1 = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              [uVar4];
      lVar2 = *(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                              container + 0x10);
      uVar3 = lVar2 + 1;
      if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                    0x18) < uVar3) {
        (*(code *)**(undefined8 **)
                    it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
                  (it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
        lVar2 = *(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                container + 0x10);
        uVar3 = lVar2 + 1;
      }
      *(ulong *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                0x10) = uVar3;
      *(char *)(*(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                container + 8) + lVar2) = cVar1;
    }
    cVar1 = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            [uVar4 + 1];
    lVar2 = *(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
                     + 0x10);
    uVar4 = lVar2 + 1;
    if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                  0x18) < uVar4) {
      (*(code *)**(undefined8 **)
                  it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
                (it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
      lVar2 = *(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                              container + 0x10);
      uVar4 = lVar2 + 1;
    }
    exp = (uint)exp % 100;
    *(ulong *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container + 0x10)
         = uVar4;
    *(char *)(*(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                              container + 8) + lVar2) = cVar1;
  }
  cVar1 = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
          [(ulong)(uint)exp * 2];
  lVar2 = *(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                   0x10);
  uVar4 = lVar2 + 1;
  if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                0x18) < uVar4) {
    (*(code *)**(undefined8 **)
                it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
              (it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
    lVar2 = *(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
                     + 0x10);
    uVar4 = lVar2 + 1;
  }
  *(ulong *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container + 0x10) =
       uVar4;
  *(char *)(*(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
                     + 8) + lVar2) = cVar1;
  cVar1 = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
          [(ulong)(uint)exp * 2 + 1];
  lVar2 = *(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                   0x10);
  uVar4 = lVar2 + 1;
  if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                0x18) < uVar4) {
    (*(code *)**(undefined8 **)
                it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
              (it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
    lVar2 = *(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
                     + 0x10);
    uVar4 = lVar2 + 1;
  }
  *(ulong *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container + 0x10) =
       uVar4;
  *(char *)(*(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
                     + 8) + lVar2) = cVar1;
  return (appender)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container
  ;
}

Assistant:

FMT_CONSTEXPR auto write_exponent(int exp, It it) -> It {
  FMT_ASSERT(-10000 < exp && exp < 10000, "exponent out of range");
  if (exp < 0) {
    *it++ = static_cast<Char>('-');
    exp = -exp;
  } else {
    *it++ = static_cast<Char>('+');
  }
  if (exp >= 100) {
    const char* top = digits2(to_unsigned(exp / 100));
    if (exp >= 1000) *it++ = static_cast<Char>(top[0]);
    *it++ = static_cast<Char>(top[1]);
    exp %= 100;
  }
  const char* d = digits2(to_unsigned(exp));
  *it++ = static_cast<Char>(d[0]);
  *it++ = static_cast<Char>(d[1]);
  return it;
}